

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::ObjectVariablesWalker::AddObjectProperties
          (ObjectVariablesWalker *this,int count,RecyclableObject *object)

{
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  DebuggerScope *pDVar6;
  undefined4 *puVar7;
  RecyclableObject *value;
  undefined4 extraout_var_00;
  DebuggerPropertyDisplayInfo *pDVar8;
  ulong uVar9;
  bool local_33;
  bool local_32;
  bool local_31 [6];
  bool isPropertyInDebuggerScope;
  bool isInDeadZone;
  bool isConst;
  ScriptContext *scriptContext;
  
  iVar3 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
  scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar3);
  pDVar6 = LocalsWalker::GetScopeWhenHaltAtFormals((this->super_VariableWalkerBase).pFrame);
  if (0 < count) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar9 = 0;
    do {
      uVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(object,uVar9 & 0xffff);
      local_31[0] = false;
      local_33 = false;
      local_32 = false;
      if (((uVar4 != 0xffffffff) &&
          (bVar2 = VariableWalkerBase::IsPropertyValid
                             (&this->super_VariableWalkerBase,uVar4,0xffffffff,&local_33,local_31,
                              &local_32), bVar2)) &&
         (iVar3 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x32])(object,(ulong)uVar4), iVar3 != 0)) {
        value = (RecyclableObject *)
                RecyclableObjectWalker::GetObject(object,object,uVar4,scriptContext);
        if (value == (RecyclableObject *)0x0) {
          value = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        if (((pDVar6 != (DebuggerScope *)0x0) &&
            (iVar3 = (pDVar6->range).end,
            iVar5 = LocalsWalker::GetAdjustedByteCodeOffset((this->super_VariableWalkerBase).pFrame)
            , iVar5 < iVar3)) &&
           (iVar3 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])(),
           *(RecyclableObject **)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 8) + 0x4f8) == value))
        {
          value = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
        }
        if (((((object->type).ptr)->typeId & ~TypeIds_Null) == TypeIds_GlobalObject) &&
           ((local_31[0] & 1U) != 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x360,"(!VarIs<RootObjectBase>(object) || !isConst)",
                                      "root object shouldn\'t produce const properties through IsPropertyValid"
                                     );
          if (!bVar2) goto LAB_008af45a;
          *puVar7 = 0;
        }
        pDVar8 = VariableWalkerBase::AllocateNewPropertyDisplayInfo
                           (&this->super_VariableWalkerBase,uVar4,value,(bool)(local_31[0] & 1),
                            local_32);
        if (pDVar8 == (DebuggerPropertyDisplayInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x368,"(info)","info");
          if (!bVar2) {
LAB_008af45a:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
        }
        this_00 = (this->super_VariableWalkerBase).pMembersList;
        JsUtil::
        List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(this_00,0);
        iVar3 = (this_00->
                super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (this_00->
        super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).buffer[iVar3] = pDVar8;
        (this_00->
        super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count = iVar3 + 1;
      }
      uVar4 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar4;
    } while (count != uVar4);
  }
  return;
}

Assistant:

void ObjectVariablesWalker::AddObjectProperties(int count, Js::RecyclableObject* object)
    {
        ScriptContext * scriptContext = pFrame->GetScriptContext();

        DebuggerScope *formalScope = LocalsWalker::GetScopeWhenHaltAtFormals(pFrame);

        // For the scopes and locals only enumerable properties will be shown.
        for (int i = 0; i < count; i++)
        {
            Js::PropertyId propertyId = object->GetPropertyId((PropertyIndex)i);

            bool isConst = false;
            bool isPropertyInDebuggerScope = false;
            bool isInDeadZone = false;
            if (propertyId != Js::Constants::NoProperty
                && IsPropertyValid(propertyId, Js::Constants::NoRegister, &isPropertyInDebuggerScope, &isConst, &isInDeadZone)
                && object->IsEnumerable(propertyId))
            {
                Var itemObj = RecyclableObjectWalker::GetObject(object, object, propertyId, scriptContext);
                if (itemObj == nullptr)
                {
                    itemObj = scriptContext->GetLibrary()->GetUndefined();
                }

                if (IsInParamScope(formalScope, pFrame) && pFrame->GetScriptContext()->IsUndeclBlockVar(itemObj))
                {
                    itemObj = scriptContext->GetLibrary()->GetUndefined();
                }

                AssertMsg(!VarIs<RootObjectBase>(object) || !isConst, "root object shouldn't produce const properties through IsPropertyValid");

                DebuggerPropertyDisplayInfo *info = AllocateNewPropertyDisplayInfo(
                    propertyId,
                    itemObj,
                    isConst,
                    isInDeadZone);

                Assert(info);
                pMembersList->Add(info);
            }
        }
    }